

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_script.cpp
# Opt level: O3

void __thiscall
cfdcapi_script_TapscriptTreeRestoreFromString_Test::TestBody
          (cfdcapi_script_TapscriptTreeRestoreFromString_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  char *tapscript;
  char *tree_str;
  int ret;
  char *leaf_hash;
  AssertionResult gtest_ar;
  uint8_t leaf_version;
  void *handle;
  void *tree_handle1;
  uint32_t branch_count;
  int tmp_ret;
  AssertHelper local_88;
  AssertHelper local_80;
  Message local_78;
  int local_6c;
  AssertHelper local_68;
  AssertHelper local_60;
  string local_58;
  uint8_t local_31;
  void *local_30;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  uint32_t local_18;
  int local_14;
  
  local_30 = (void *)0x0;
  local_6c = CfdCreateHandle(&local_30);
  local_28.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_28.ptr_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_58,"kCfdSuccess","ret",(CfdErrorCode *)&local_28,&local_6c);
  if ((char)local_58._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_28);
    if ((undefined8 *)local_58._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_58._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x2f3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_58._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ptr_._0_1_ = local_30 != (void *)0x0;
  local_20.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_30 == (void *)0x0) {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,(internal *)&local_28,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x2f4,(char *)CONCAT71(local_58._M_dataplus._M_p._1_7_,
                                       (char)local_58._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_58._M_dataplus._M_p._1_7_,(char)local_58._M_dataplus._M_p) !=
        &local_58.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_58._M_dataplus._M_p._1_7_,(char)local_58._M_dataplus._M_p));
    }
    if (local_80.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_80.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_80.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_14 = 0;
  local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_6c = CfdInitializeTaprootScriptTree(local_30,&local_28.ptr_);
  local_80.data_ = (AssertHelperData *)((ulong)local_80.data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_58,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&local_6c);
  if ((char)local_58._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_80);
    if ((undefined8 *)local_58._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_58._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x2f9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_80.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_80.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_80.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_58._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_6c == 0) {
    pcVar2 = "";
    local_6c = CfdSetScriptTreeFromString
                         (local_30,local_28.ptr_,
                          "{{tl(20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac),tl(51)},tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}"
                          ,"20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac",
                          0xc0,"");
    local_80.data_ = local_80.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_58,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&local_6c);
    if ((char)local_58._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_80);
      if ((undefined8 *)local_58._M_string_length != (undefined8 *)0x0) {
        pcVar2 = *(char **)local_58._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x2fd,pcVar2);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if (local_80.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_80.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_80.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_58._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_18 = 0;
    local_6c = CfdGetTapBranchCount(local_30,local_28.ptr_,&local_18);
    local_80.data_ = local_80.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_58,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&local_6c);
    if ((char)local_58._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_80);
      if ((undefined8 *)local_58._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_58._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x301,pcVar2);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if (local_80.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_80.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_80.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_58._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_80.data_._0_4_ = 2;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              ((internal *)&local_58,"2","branch_count",(int *)&local_80,&local_18);
    if ((char)local_58._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_80);
      if ((undefined8 *)local_58._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_58._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x302,pcVar2);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if (local_80.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_80.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_80.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_58._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_80.data_ = (AssertHelperData *)0x0;
    local_6c = CfdGetTaprootScriptTreeSrting(local_30,local_28.ptr_,(char **)&local_80);
    local_88.data_ = (AssertHelperData *)((ulong)local_88.data_._4_4_ << 0x20);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_58,"kCfdSuccess","ret",(CfdErrorCode *)&local_88,&local_6c);
    if ((char)local_58._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_88);
      if ((undefined8 *)local_58._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_58._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x306,pcVar2);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_88.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_88.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_88.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_58._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_6c == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_58,
                 "\"{{tl(20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac),tl(51)},tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}\""
                 ,"tree_str",
                 "{{tl(20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac),tl(51)},tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}"
                 ,(char *)local_80.data_);
      if ((char)local_58._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_88);
        if ((undefined8 *)local_58._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_58._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x30a,pcVar2);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_88);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if (local_88.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_88.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_88.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_58._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer((char *)local_80.data_);
      local_80.data_ = (AssertHelperData *)0x0;
    }
    local_31 = '\0';
    local_88.data_ = (AssertHelperData *)0x0;
    local_60.data_ = (AssertHelperData *)0x0;
    local_6c = CfdGetBaseTapLeaf(local_30,local_28.ptr_,&local_31,(char **)&local_88,
                                 (char **)&local_60);
    local_78.ss_.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_58,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,&local_6c);
    if ((char)local_58._M_dataplus._M_p == '\0') {
      testing::Message::Message(&local_78);
      if ((undefined8 *)local_58._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_58._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x314,pcVar2);
      testing::internal::AssertHelper::operator=(&local_68,&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_58._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_6c == 0) {
      local_78.ss_.ptr_._0_4_ = 0xc0;
      testing::internal::CmpHelperEQ<int,unsigned_char>
                ((internal *)&local_58,"0xc0","leaf_version",(int *)&local_78,&local_31);
      if ((char)local_58._M_dataplus._M_p == '\0') {
        testing::Message::Message(&local_78);
        if ((undefined8 *)local_58._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_58._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x316,pcVar2);
        testing::internal::AssertHelper::operator=(&local_68,&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        if (CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             ((long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_58._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_58,"tapscript_str","tapscript",
                 "20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac",
                 (char *)local_88.data_);
      if ((char)local_58._M_dataplus._M_p == '\0') {
        testing::Message::Message(&local_78);
        if ((undefined8 *)local_58._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_58._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x317,pcVar2);
        testing::internal::AssertHelper::operator=(&local_68,&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        if (CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             ((long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_58._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_58,
                 "\"4691fbb1196f4675241c8958a7ab6378a63aa0cc008ed03d216fd038357f52fd\"","leaf_hash",
                 "4691fbb1196f4675241c8958a7ab6378a63aa0cc008ed03d216fd038357f52fd",
                 (char *)local_60.data_);
      if ((char)local_58._M_dataplus._M_p == '\0') {
        testing::Message::Message(&local_78);
        if ((undefined8 *)local_58._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_58._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x31a,pcVar2);
        testing::internal::AssertHelper::operator=(&local_68,&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        if (CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             ((long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_58._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer((char *)local_88.data_);
      local_88.data_ = (AssertHelperData *)0x0;
      CfdFreeStringBuffer((char *)local_60.data_);
      local_60.data_ = (AssertHelperData *)0x0;
    }
    local_14 = CfdFreeTaprootScriptTreeHandle(local_30,local_28.ptr_);
    local_78.ss_.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_58,"kCfdSuccess","tmp_ret",(CfdErrorCode *)&local_78,&local_14);
    if ((char)local_58._M_dataplus._M_p == '\0') {
      testing::Message::Message(&local_78);
      if ((undefined8 *)local_58._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_58._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x322,pcVar2);
      testing::internal::AssertHelper::operator=(&local_68,&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_58._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  local_6c = CfdGetLastErrorCode(local_30);
  if (local_6c != 0) {
    local_80.data_ = (AssertHelperData *)0x0;
    local_6c = CfdGetLastErrorMessage(local_30,(char **)&local_80);
    local_88.data_ = local_88.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_58,"kCfdSuccess","ret",(CfdErrorCode *)&local_88,&local_6c);
    if ((char)local_58._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_88);
      if ((undefined8 *)local_58._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_58._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x329,pcVar2);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_88.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_88.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_88.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_58._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pcVar2 = "";
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_58,"\"\"","str_buffer","",(char *)local_80.data_);
    if ((char)local_58._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_88);
      if ((undefined8 *)local_58._M_string_length != (undefined8 *)0x0) {
        pcVar2 = *(char **)local_58._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x32a,pcVar2);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_88.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_88.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_88.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_58._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    CfdFreeStringBuffer((char *)local_80.data_);
  }
  local_6c = CfdFreeHandle(local_30);
  local_80.data_ = local_80.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_58,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&local_6c);
  if ((char)local_58._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_80);
    if ((undefined8 *)local_58._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_58._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x330,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_80.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_80.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_80.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_58._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(cfdcapi_script, TapscriptTreeRestoreFromString) {
  const char* exp_tree_str = "{{tl(20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac),tl(51)},tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}";
  const char* tapscript_str = "20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac";

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  int tmp_ret = 0;
  void* tree_handle1 = nullptr;
  ret = CfdInitializeTaprootScriptTree(handle, &tree_handle1);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    ret = CfdSetScriptTreeFromString(handle, tree_handle1,
        exp_tree_str, tapscript_str, 0xc0, "");
    EXPECT_EQ(kCfdSuccess, ret);

    uint32_t branch_count = 0;
    ret = CfdGetTapBranchCount(handle, tree_handle1, &branch_count);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(2, branch_count);

    char* tree_str = nullptr;
    ret = CfdGetTaprootScriptTreeSrting(handle, tree_handle1, &tree_str);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(
        "{{tl(20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac),tl(51)},tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}",
        tree_str);
      CfdFreeStringBuffer(tree_str);
      tree_str = nullptr;
    }

    uint8_t leaf_version = 0;
    char* tapscript = nullptr;
    char* leaf_hash = nullptr;
    ret = CfdGetBaseTapLeaf(handle, tree_handle1,
        &leaf_version, &tapscript, &leaf_hash);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_EQ(0xc0, leaf_version);
      EXPECT_STREQ(tapscript_str, tapscript);
      EXPECT_STREQ(
        "4691fbb1196f4675241c8958a7ab6378a63aa0cc008ed03d216fd038357f52fd",
        leaf_hash);
      CfdFreeStringBuffer(tapscript);
      tapscript = nullptr;
      CfdFreeStringBuffer(leaf_hash);
      leaf_hash = nullptr;
    }

    tmp_ret = CfdFreeTaprootScriptTreeHandle(handle, tree_handle1);
    EXPECT_EQ(kCfdSuccess, tmp_ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}